

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles31::Functional::TextureSpecCase::iterate(TextureSpecCase *this)

{
  ContextWrapper *this_00;
  ReferenceContext *this_01;
  int iVar1;
  RenderContext *context;
  TestLog *log;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  TestError *this_02;
  NotSupportedError *this_03;
  int height;
  ReferenceContext *pRVar8;
  int width;
  Random rnd;
  ReferenceContextBuffers refBuffers;
  GLContext gles31Context;
  ReferenceContext refContext;
  PixelBufferAccess local_64d0;
  deRandom local_64a8;
  ReferenceContextLimits local_6498;
  ReferenceContextBuffers local_6440;
  MultisamplePixelBufferAccess local_63c8;
  MultisamplePixelBufferAccess local_63a0;
  MultisamplePixelBufferAccess local_6378;
  undefined1 local_6350 [368];
  ReferenceContext local_61e0;
  int *piVar7;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar4 = (*context->_vptr_RenderContext[4])(context);
  piVar7 = (int *)CONCAT44(extraout_var,iVar4);
  if ((*piVar7 < 0x100) || (piVar7[1] < 0x100)) {
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_03,"Too small viewport",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
               ,0x8d);
  }
  else {
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    if ((char)iVar4 != '\0') {
      dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                           _M_p);
      deRandom_init(&local_64a8,dVar5);
      iVar4 = *piVar7;
      width = 0x100;
      if (iVar4 < 0x100) {
        width = iVar4;
      }
      height = 0x100;
      if (piVar7[1] < 0x100) {
        height = piVar7[1];
      }
      dVar5 = deRandom_getUint32(&local_64a8);
      iVar1 = piVar7[1];
      dVar6 = deRandom_getUint32(&local_64a8);
      local_61e0.super_Context._vptr_Context =
           (_func_int **)CONCAT44(dVar6 % ((iVar1 - height) + 1U),dVar5 % ((iVar4 - width) + 1U));
      local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)(ApiType)width;
      local_61e0.super_Context._12_4_ = height;
      sglr::GLContext::GLContext
                ((GLContext *)local_6350,context,log,1,(IVec4 *)(local_6350 + 0x170));
      local_61e0.super_Context._12_4_ = (uint)(piVar7[5] != 0) << 3;
      local_61e0.super_Context._vptr_Context = (_func_int **)0x800000008;
      local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
      sglr::ReferenceContextBuffers::ReferenceContextBuffers
                (&local_6440,(PixelFormat *)(local_6350 + 0x170),0,0,width,height,1);
      sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6498,context);
      tcu::TextureLevel::getAccess(&local_64d0,&local_6440.m_colorbuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_64d0);
      tcu::TextureLevel::getAccess(&local_64d0,&local_6440.m_depthbuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_64d0);
      tcu::TextureLevel::getAccess(&local_64d0,&local_6440.m_stencilbuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_64d0);
      this_01 = (ReferenceContext *)(local_6350 + 0x170);
      sglr::ReferenceContext::ReferenceContext
                (this_01,&local_6498,&local_6378,&local_63a0,&local_63c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6498.extensionStr._M_dataplus._M_p != &local_6498.extensionStr.field_2) {
        operator_delete(local_6498.extensionStr._M_dataplus._M_p,
                        local_6498.extensionStr.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_6498.extensionList);
      this_00 = &this->super_ContextWrapper;
      bVar3 = true;
      do {
        bVar2 = bVar3;
        pRVar8 = this_01;
        if (bVar2) {
          pRVar8 = (ReferenceContext *)local_6350;
        }
        sglr::ContextWrapper::setContext(this_00,&pRVar8->super_Context);
        sglr::ContextWrapper::glClearColor(this_00,0.125,0.25,0.5,1.0);
        sglr::ContextWrapper::glClear(this_00,0x4500);
        bVar3 = false;
      } while (bVar2);
      bVar3 = true;
      while( true ) {
        pRVar8 = this_01;
        if (bVar3) {
          pRVar8 = (ReferenceContext *)local_6350;
        }
        sglr::ContextWrapper::setContext(this_00,&pRVar8->super_Context);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
        dVar5 = sglr::ContextWrapper::glGetError(this_00);
        if (dVar5 != 0) break;
        bVar2 = !bVar3;
        bVar3 = false;
        if (bVar2) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          sglr::GLContext::enableLogging((GLContext *)local_6350,0);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                    (this,local_6350,local_6350 + 0x170);
          sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)(local_6350 + 0x170));
          tcu::TextureLevel::~TextureLevel(&local_6440.m_stencilbuffer);
          tcu::TextureLevel::~TextureLevel(&local_6440.m_depthbuffer);
          tcu::TextureLevel::~TextureLevel(&local_6440.m_colorbuffer);
          sglr::GLContext::~GLContext((GLContext *)local_6350);
          return STOP;
        }
      }
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,(char *)0x0,"glGetError() == GL_NO_ERROR",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                 ,0xab);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_03,"Extension not supported",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
               ,0x90);
  }
  __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureSpecCase::IterateResult TextureSpecCase::iterate (void)
{
	glu::RenderContext&			renderCtx				= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();

	if (renderTarget.getWidth() < VIEWPORT_WIDTH || renderTarget.getHeight() < VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	if (!checkExtensionSupport())
		throw tcu::NotSupportedError("Extension not supported", "", __FILE__, __LINE__);

	// Context size, and viewport for GLES3.1
	de::Random	rnd			(deStringHash(getName()));
	int			width		= deMin32(renderTarget.getWidth(),	VIEWPORT_WIDTH);
	int			height		= deMin32(renderTarget.getHeight(),	VIEWPORT_HEIGHT);
	int			x			= rnd.getInt(0, renderTarget.getWidth()		- width);
	int			y			= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Contexts.
	sglr::GLContext					gles31Context	(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
	sglr::ReferenceContextBuffers	refBuffers		(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, width, height);
	sglr::ReferenceContext			refContext		(sglr::ReferenceContextLimits(renderCtx), refBuffers.getColorbuffer(), refBuffers.getDepthbuffer(), refBuffers.getStencilbuffer());

	// Clear color buffer.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles31Context);
		glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	}

	// Construct texture using both GLES3.1 and reference contexts.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles31Context);
		createTexture();
		TCU_CHECK(glGetError() == GL_NO_ERROR);
	}

	// Initialize case result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Disable logging.
	gles31Context.enableLogging(0);

	// Verify results.
	verifyTexture(gles31Context, refContext);

	return STOP;
}